

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O3

shared_ptr<ApprovalTests::GenericDiffReporter> __thiscall
ApprovalTests::CustomReporter::createForegroundReporter
          (CustomReporter *this,string *path,string *arguments,Type type,bool allowNonZeroExitCodes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar3;
  DiffInfo info;
  undefined1 local_a9;
  string local_a8;
  string local_88;
  DiffInfo local_68;
  
  local_a8._M_dataplus._M_p = (path->_M_dataplus)._M_p;
  paVar1 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == paVar1) {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.field_2._8_8_ = *(undefined8 *)((long)&path->field_2 + 8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_a8._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar1;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (arguments->_M_dataplus)._M_p;
  paVar1 = &arguments->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&arguments->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = arguments->_M_string_length;
  (arguments->_M_dataplus)._M_p = (pointer)paVar1;
  arguments->_M_string_length = 0;
  (arguments->field_2)._M_local_buf[0] = '\0';
  DiffInfo::DiffInfo(&local_68,&local_a8,&local_88,type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  *(undefined8 *)this = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ApprovalTests::GenericDiffReporter,std::allocator<ApprovalTests::GenericDiffReporter>,ApprovalTests::DiffInfo&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(GenericDiffReporter **)this,
             (allocator<ApprovalTests::GenericDiffReporter> *)&local_a9,&local_68);
  SystemLauncher::setForeground((SystemLauncher *)(*(long *)this + 0x60),true);
  SystemLauncher::setAllowNonZeroExitCodes
            ((SystemLauncher *)(*(long *)this + 0x60),allowNonZeroExitCodes);
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.arguments._M_dataplus._M_p != &local_68.arguments.field_2) {
    operator_delete(local_68.arguments._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.program._M_dataplus._M_p != &local_68.program.field_2) {
    operator_delete(local_68.program._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter> CustomReporter::createForegroundReporter(
        std::string path, std::string arguments, Type type, bool allowNonZeroExitCodes)
    {
        DiffInfo info(std::move(path), std::move(arguments), type);
        auto reporter = std::make_shared<GenericDiffReporter>(info);
        reporter->launcher.setForeground(true);
        reporter->launcher.setAllowNonZeroExitCodes(allowNonZeroExitCodes);
        return reporter;
    }